

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_size_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_FieldOrderingsSize_Test::
~GeneratedMessageTest_FieldOrderingsSize_Test(GeneratedMessageTest_FieldOrderingsSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageTest, FieldOrderingsSize) {
  // TODO: remove once synthetic_pdproto lands.
#ifndef PROTOBUF_FORCE_SPLIT
  struct MockGenerated : public MockMessageBase {  // 16 bytes
    int has_bits[1];                               // 4 bytes
    int cached_size;                               // 4 bytes
    MockExtensionSet extensions;                   // 24 bytes
    void* my_string;                               // 8 bytes
    void* optional_nested_message;                 // 8 bytes
    int64_t my_int;                                // 8 bytes
    float my_float;                                // 4 bytes
    PROTOBUF_TSAN_DECLARE_MEMBER;                  // 0-4 bytes
    // + 0-4 bytes padding
  };
  ABSL_CHECK_MESSAGE_SIZE(MockGenerated, 80);
#else   // !PROTOBUF_FORCE_SPLIT
  struct MockGenerated : public MockMessageBase {  // 16 bytes
    int has_bits[1];                               // 4 bytes
    int cached_size;                               // 4 bytes
    MockExtensionSet extensions;                   // 24 bytes
    void* split;                                   // 8 bytes
    PROTOBUF_TSAN_DECLARE_MEMBER;                  // 0-4 bytes
    // + 0-4 bytes padding
  };
  ABSL_CHECK_MESSAGE_SIZE(MockGenerated, 56);
#endif  // PROTOBUF_FORCE_SPLIT
  EXPECT_EQ(sizeof(proto2_unittest::TestFieldOrderings), sizeof(MockGenerated));
}